

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

void __thiscall SQLite::Statement::Statement(Statement *this,Database *aDatabase,string *aQuery)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  int iVar3;
  
  (this->mQuery)._M_dataplus._M_p = (pointer)&(this->mQuery).field_2;
  pcVar2 = (aQuery->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + aQuery->_M_string_length)
  ;
  Ptr::Ptr(&this->mStmtPtr,aDatabase->mpSQLite,&this->mQuery);
  this->mColumnCount = 0;
  p_Var1 = &(this->mColumnNames)._M_t._M_impl.super__Rb_tree_header;
  (this->mColumnNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mColumnNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mColumnNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mColumnNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mColumnNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mbHasRow = false;
  this->mbDone = false;
  iVar3 = sqlite3_column_count((this->mStmtPtr).mpStmt);
  this->mColumnCount = iVar3;
  return;
}

Assistant:

Statement::Statement(Database &aDatabase, const std::string& aQuery) :
    mQuery(aQuery),
    mStmtPtr(aDatabase.mpSQLite, mQuery), // prepare the SQL query, and ref count (needs Database friendship)
    mColumnCount(0),
    mbHasRow(false),
    mbDone(false)
{
    mColumnCount = sqlite3_column_count(mStmtPtr);
}